

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_firstInstanceWithType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  bool bVar1;
  sysbvm_heap_mallocObjectHeader_t *local_40;
  sysbvm_heap_mallocObjectHeader_t *nextObject;
  sysbvm_tuple_t expectedType;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  local_40 = (context->heap).firstMallocObject;
  while( true ) {
    bVar1 = false;
    if (local_40 != (sysbvm_heap_mallocObjectHeader_t *)0x0) {
      bVar1 = local_40[1].field_0.field_0.next != (sysbvm_heap_mallocObjectHeader_s *)*arguments;
    }
    if (!bVar1) break;
    local_40 = (local_40->field_0).field_0.next;
  }
  if (local_40 == (sysbvm_heap_mallocObjectHeader_t *)0x0) {
    context_local = (sysbvm_context_t *)0x0;
  }
  else {
    context_local = (sysbvm_context_t *)(local_40 + 1);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_firstInstanceWithType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t expectedType = arguments[0];

    sysbvm_heap_mallocObjectHeader_t *nextObject = context->heap.firstMallocObject;
    while(nextObject && ((sysbvm_tuple_header_t *)(nextObject + 1))->typePointer != expectedType)
        nextObject = nextObject->next;
    
    if(!nextObject)
        return SYSBVM_NULL_TUPLE;

    return (sysbvm_tuple_t)(nextObject + 1);
}